

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_init_cleared(roaring_bitmap_t *r)

{
  if (r != (roaring_bitmap_t *)0x0) {
    (r->high_low_container).keys = (uint16_t *)0x0;
    (r->high_low_container).typecodes = (uint8_t *)0x0;
    (r->high_low_container).size = 0;
    (r->high_low_container).allocation_size = 0;
    (r->high_low_container).containers = (void **)0x0;
    (r->high_low_container).flags = '\0';
  }
  return;
}

Assistant:

bool ra_init_with_capacity(roaring_array_t *new_ra, uint32_t cap) {
    if (!new_ra) return false;
    ra_init(new_ra);

    // Containers hold 64Ki elements, so 64Ki containers is enough to hold
    // `0x10000 * 0x10000` (all 2^32) elements
    if (cap > 0x10000) {
        cap = 0x10000;
    }

    if (cap > 0) {
        void *bigalloc = roaring_malloc(
            cap * (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t)));
        if (bigalloc == NULL) return false;
        new_ra->containers = (container_t **)bigalloc;
        new_ra->keys = (uint16_t *)(new_ra->containers + cap);
        new_ra->typecodes = (uint8_t *)(new_ra->keys + cap);
        // Narrowing is safe because of above check
        new_ra->allocation_size = (int32_t)cap;
    }
    return true;
}